

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap1.c
# Opt level: O3

void ftgiou_(int *A1,int *A2)

{
  Cffgiou(A1,A2);
  return;
}

Assistant:

void Cfffiou( int unit, int *status )
{
   if( *status>0 ) return;
   FFLOCK;
   if( unit == -1 ) {
      int i; for( i=50; i<NMAXFILES; ) gFitsFiles[i++]=NULL;
   } else if( unit<1 || unit>=NMAXFILES ) {
      *status = BAD_FILEPTR;
      ffpmsg("Cfffiou was sent an unacceptable unit number.");
   } else gFitsFiles[unit]=NULL;
   FFUNLOCK;
}